

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<13,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_2,_4> *extraout_RDX;
  Matrix<float,_2,_4> *extraout_RDX_00;
  Matrix<float,_2,_4> *mat;
  Type in0;
  Mat4x2 local_98;
  Vector<float,_3> local_78;
  Vector<float,_3> local_68;
  tcu local_5c [12];
  VecAccess<float,_4,_3> local_50;
  Matrix<float,_2,_4> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,11>(&local_98,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_2,_4>::Matrix(&local_98,(float *)s_constInMat4x2);
    mat = extraout_RDX_00;
  }
  local_68.m_data[2] = local_98.m_data.m_data[2].m_data[0] + local_98.m_data.m_data[2].m_data[1];
  local_68.m_data[0] =
       local_98.m_data.m_data[3].m_data[0] +
       local_98.m_data.m_data[0].m_data[0] + local_98.m_data.m_data[0].m_data[1];
  local_68.m_data[1] =
       local_98.m_data.m_data[3].m_data[1] +
       local_98.m_data.m_data[1].m_data[1] + local_98.m_data.m_data[1].m_data[0];
  increment<float,2,4>(&local_38,(MatrixCaseUtils *)&local_98,mat);
  local_78.m_data[2] = local_38.m_data.m_data[2].m_data[0] + local_38.m_data.m_data[2].m_data[1];
  local_78.m_data[0] =
       local_38.m_data.m_data[3].m_data[0] +
       local_38.m_data.m_data[0].m_data[0] + local_38.m_data.m_data[0].m_data[1];
  local_78.m_data[1] =
       local_38.m_data.m_data[3].m_data[1] +
       local_38.m_data.m_data[1].m_data[1] + local_38.m_data.m_data[1].m_data[0];
  tcu::operator+(local_5c,&local_68,&local_78);
  local_50.m_vector = &evalCtx->color;
  local_50.m_index[0] = 0;
  local_50.m_index[1] = 1;
  local_50.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_50,(Vector<float,_3> *)local_5c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(increment(in0));
	}